

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.cpp
# Opt level: O2

void __thiscall libDAI::NDP::NDP(NDP *this,FactorGraph *fg,Properties *opts,size_t k)

{
  pointer pvVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  reference pvVar4;
  undefined4 extraout_var_07;
  long lVar5;
  size_t i;
  ulong uVar6;
  allocator<char> local_71;
  Exception *local_70;
  string local_68;
  list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *local_48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_38;
  
  DAIAlg<libDAI::FactorGraph>::DAIAlg(&this->super_DAIAlgFG,fg,opts);
  (this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm =
       (_func_int **)&PTR_clone_0061f908;
  (this->Props).verbose = 0;
  this->_m_induced_width = 0;
  iVar2 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[5])(fg);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->_m_varOrder,CONCAT44(extraout_var,iVar2),(allocator_type *)&local_68);
  this->_m_deadlineInSeconds = 0.0;
  iVar2 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[5])(fg);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            (&this->_m_newFacs,CONCAT44(extraout_var_00,iVar2),(allocator_type *)&local_68);
  iVar2 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[5])(fg);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&this->_m_bestResps,CONCAT44(extraout_var_01,iVar2),(allocator_type *)&local_68);
  iVar2 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[5])(fg);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&this->_m_neighV,CONCAT44(extraout_var_02,iVar2),(allocator_type *)&local_68);
  local_38 = &this->_m_varOrder;
  iVar2 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[9])(fg);
  iVar3 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[5])(fg);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&this->_m_neighF,CONCAT44(extraout_var_04,iVar3) + CONCAT44(extraout_var_03,iVar2),
           (allocator_type *)&local_68);
  this->_g = fg;
  iVar2 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[5])(fg);
  local_40 = &this->_m_bestConfiguration;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (local_40,CONCAT44(extraout_var_05,iVar2),(allocator_type *)&local_68);
  local_48 = &this->_valConfs;
  this->_k = k;
  (this->_valConfs).
  super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)local_48;
  (this->_valConfs).
  super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_48;
  (this->_valConfs).
  super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this->_k_th_Val = -1.79769313486232e+308;
  iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0x11])(this);
  if ((char)iVar2 != '\0') {
    lVar5 = 0;
    uVar6 = 0;
    while( true ) {
      iVar2 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[5])(fg);
      if (CONCAT44(extraout_var_06,iVar2) <= uVar6) break;
      pvVar1 = (fg->_fg)._nb1.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar4 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::at(&this->_m_neighV,uVar6);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (pvVar4,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        ((long)&(pvVar1->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar5));
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x18;
    }
    lVar5 = 0;
    uVar6 = 0;
    while( true ) {
      iVar2 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[9])(fg);
      if (CONCAT44(extraout_var_07,iVar2) <= uVar6) break;
      pvVar1 = (fg->_fg)._nb2.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar4 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::at(&this->_m_neighF,uVar6);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (pvVar4,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        ((long)&(pvVar1->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar5));
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x18;
    }
    return;
  }
  local_70 = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"ndp.cpp, line 108",&local_71);
  Exception::Exception(local_70,8,&local_68);
  __cxa_throw(local_70,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

NDP::NDP(const FactorGraph & fg, const Properties &opts, size_t k ) 
        : 
            DAIAlgFG(fg, opts),
            Props(),
            //_maxdiff(0.0),
            //_iterations(0UL),
            //_indices(),
            //_messages(),
            //_newmessages(),
            _m_induced_width(0),
            _m_varOrder( fg.nrVars() ),
            _m_deadlineInSeconds(0),
            _m_newFacs(  fg.nrVars() ),
            _m_bestResps(fg.nrVars() ),
            _m_neighV(   fg.nrVars() ),
            //original factors + the ones that will be introduced.
            _m_neighF(   fg.nrFactors() + fg.nrVars() ),
            _g(&fg) ,
            _m_bestConfiguration( fg.nrVars() ),
            _k(k),
            _k_th_Val(-DBL_MAX)//,
            //writeAnyTimeResults(false),
            //results_f(NULL),
            //timings_f(NULL)
    {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);

        for(size_t i=0; i < fg.nrVars() ; i++)
            //initialize neighborhoods from original model
            _m_neighV.at(i) = fg.nbV(i);
        
        for(size_t i=0; i < fg.nrFactors() ; i++)
            //initialize neighborhoods from original model
            _m_neighF.at(i) = fg.nbF(i);
            //the neighborhoods for the 'new' factors remain uninitialized.

/*        
        // clear messages
        _messages.clear();
        _messages.reserve(grm().nrEdges());

        // clear indices
        _indices.clear();
        _indices.reserve(grm().nrEdges());

        // create messages and indices
        for( size_t iI = 0; iI < grm().nrEdges(); iI++ ) {
            size_t i = grm().edge(iI).first;
            size_t I = grm().edge(iI).second;

            _messages.push_back( Prob( grm().var(i).states() ) );

            vector<size_t> ind( grm().factor(I).stateSpace(), 0 );
            Index indi (grm().var(i), grm().factor(I).vars() );
            for( size_t j = 0; indi >= 0; ++indi,++j )
                ind[j] = indi; 
            _indices.push_back( ind );
        }

        // create new_messages
        _newmessages = _messages;
*/        
    }